

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O0

bool __thiscall ON_Brep::IsManifold(ON_Brep *this,bool *pbIsOriented,bool *pbHasBoundary)

{
  int iVar1;
  TYPE TVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  ON_BrepFace *pOVar11;
  int *piVar12;
  ON_BrepLoop *pOVar13;
  ON_BrepTrim *pOVar14;
  ON_BrepEdge *pOVar15;
  ON_BrepTrim *pOVar16;
  ON_BrepLoop *pOVar17;
  ON_BrepFace *pOVar18;
  bool local_9b;
  bool local_9a;
  bool local_99;
  byte local_8a;
  byte local_89;
  bool bFlipOther;
  bool bFlipTrim;
  ON_BrepTrim *other_trim;
  ON_BrepEdge *edge;
  ON_BrepTrim *trim;
  int ti;
  ON_BrepLoop *loop;
  int li;
  ON_BrepFace *face;
  bool bKeepGoing;
  int brep_edge_count;
  int brep_trim_count;
  int brep_loop_count;
  int lti;
  int fli;
  int tcnt;
  int lcnt;
  int other_ti;
  int fi;
  bool bHasBoundary;
  bool bIsOriented;
  bool bIsManifold;
  int fcnt;
  bool *pbHasBoundary_local;
  bool *pbIsOriented_local;
  ON_Brep *this_local;
  
  iVar4 = ON_ClassArray<ON_BrepFace>::Count((ON_ClassArray<ON_BrepFace> *)&this->m_F);
  face._3_1_ = (bool)(-(0 < iVar4) & 1);
  bVar3 = false;
  if (pbIsOriented != (bool *)0x0) {
    *pbIsOriented = face._3_1_;
  }
  if (pbHasBoundary != (bool *)0x0) {
    *pbHasBoundary = false;
  }
  iVar5 = ON_ClassArray<ON_BrepLoop>::Count((ON_ClassArray<ON_BrepLoop> *)&this->m_L);
  iVar6 = ON_ClassArray<ON_BrepTrim>::Count((ON_ClassArray<ON_BrepTrim> *)&this->m_T);
  iVar7 = ON_ClassArray<ON_BrepEdge>::Count((ON_ClassArray<ON_BrepEdge> *)&this->m_E);
  lcnt = 0;
  other_ti._2_1_ = face._3_1_;
  other_ti._3_1_ = face._3_1_;
  do {
    local_99 = false;
    if (lcnt < iVar4) {
      local_99 = face._3_1_;
    }
    if (local_99 == false) {
      if (other_ti._3_1_ == false) {
        other_ti._2_1_ = false;
      }
      if (pbIsOriented != (bool *)0x0) {
        *pbIsOriented = other_ti._2_1_;
      }
      if (pbHasBoundary != (bool *)0x0) {
        *pbHasBoundary = bVar3;
      }
      if (((other_ti._3_1_ == false) || (bVar3 != false)) && (this->m_is_solid != 3)) {
        this->m_is_solid = 3;
      }
      return other_ti._3_1_;
    }
    pOVar11 = ON_ClassArray<ON_BrepFace>::operator[]((ON_ClassArray<ON_BrepFace> *)&this->m_F,lcnt);
    if (pOVar11->m_face_index != -1) {
      iVar8 = ON_SimpleArray<int>::Count(&pOVar11->m_li);
      if ((iVar8 < 1) && (other_ti._3_1_ = false, pbHasBoundary == (bool *)0x0)) {
        face._3_1_ = false;
      }
      brep_loop_count = 0;
      while( true ) {
        local_9a = false;
        if (brep_loop_count < iVar8) {
          local_9a = face._3_1_;
        }
        if (local_9a == false) break;
        piVar12 = ON_SimpleArray<int>::operator[](&pOVar11->m_li,brep_loop_count);
        iVar9 = *piVar12;
        if ((iVar9 < 0) || (iVar5 <= iVar9)) {
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_brep.cpp"
                     ,0x1b8e,"","Bogus loop index in face.m_li[]");
        }
        else {
          pOVar13 = ON_ClassArray<ON_BrepLoop>::operator[]
                              ((ON_ClassArray<ON_BrepLoop> *)&this->m_L,iVar9);
          iVar9 = ON_SimpleArray<int>::Count(&pOVar13->m_ti);
          if ((iVar9 < 1) && (other_ti._3_1_ = false, pbHasBoundary == (bool *)0x0)) {
            face._3_1_ = false;
          }
          brep_trim_count = 0;
          while( true ) {
            local_9b = false;
            if (brep_trim_count < iVar9) {
              local_9b = face._3_1_;
            }
            if (local_9b == false) break;
            piVar12 = ON_SimpleArray<int>::operator[](&pOVar13->m_ti,brep_trim_count);
            iVar1 = *piVar12;
            if ((iVar1 < 0) || (iVar6 <= iVar1)) {
              ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_brep.cpp"
                         ,0x1b9d,"","Bogus loop index in loop.m_ti[]");
            }
            else {
              pOVar14 = ON_ClassArray<ON_BrepTrim>::operator[]
                                  ((ON_ClassArray<ON_BrepTrim> *)&this->m_T,iVar1);
              TVar2 = pOVar14->m_type;
              if (TVar2 == boundary) {
                bVar3 = true;
              }
              else if (TVar2 - mated < 2) {
                if ((pOVar14->m_ei < 0) || (iVar7 <= pOVar14->m_ei)) {
                  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_brep.cpp"
                             ,0x1bf6,"","Bogus trim.m_ei or trim.m_type value");
                }
                else {
                  pOVar15 = ON_ClassArray<ON_BrepEdge>::operator[]
                                      ((ON_ClassArray<ON_BrepEdge> *)&this->m_E,pOVar14->m_ei);
                  iVar10 = ON_SimpleArray<int>::Count(&pOVar15->m_ti);
                  if (iVar10 == 2) {
                    piVar12 = ON_SimpleArray<int>::operator[](&pOVar15->m_ti,0);
                    tcnt = *piVar12;
                    if (tcnt == iVar1) {
                      piVar12 = ON_SimpleArray<int>::operator[](&pOVar15->m_ti,1);
                      tcnt = *piVar12;
                    }
                    if (tcnt == iVar1) {
                      other_ti._3_1_ = false;
                      if (pbHasBoundary == (bool *)0x0) {
                        face._3_1_ = false;
                      }
                    }
                    else {
                      pOVar16 = ON_ClassArray<ON_BrepTrim>::operator[]
                                          ((ON_ClassArray<ON_BrepTrim> *)&this->m_T,tcnt);
                      local_89 = pOVar14->m_bRev3d & 1;
                      if ((pOVar14->m_li < 0) || (iVar5 <= pOVar14->m_li)) {
                        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_brep.cpp"
                                   ,0x1bd2,"","Bogus loop index in trim.m_li");
                      }
                      else {
                        pOVar17 = ON_ClassArray<ON_BrepLoop>::operator[]
                                            ((ON_ClassArray<ON_BrepLoop> *)&this->m_L,pOVar14->m_li)
                        ;
                        if (-1 < pOVar17->m_fi) {
                          pOVar17 = ON_ClassArray<ON_BrepLoop>::operator[]
                                              ((ON_ClassArray<ON_BrepLoop> *)&this->m_L,
                                               pOVar14->m_li);
                          iVar1 = pOVar17->m_fi;
                          iVar10 = ON_ClassArray<ON_BrepFace>::Count
                                             ((ON_ClassArray<ON_BrepFace> *)&this->m_F);
                          if (iVar1 < iVar10) {
                            pOVar17 = ON_ClassArray<ON_BrepLoop>::operator[]
                                                ((ON_ClassArray<ON_BrepLoop> *)&this->m_L,
                                                 pOVar14->m_li);
                            pOVar18 = ON_ClassArray<ON_BrepFace>::operator[]
                                                ((ON_ClassArray<ON_BrepFace> *)&this->m_F,
                                                 pOVar17->m_fi);
                            if ((pOVar18->m_bRev & 1U) != 0) {
                              local_89 = (local_89 ^ 0xff) & 1;
                            }
                            local_8a = pOVar16->m_bRev3d & 1;
                            if ((pOVar16->m_li < 0) || (iVar5 <= pOVar16->m_li)) {
                              ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_brep.cpp"
                                         ,0x1be5,"","Bogus loop index in other_trim.m_li");
                            }
                            else {
                              pOVar17 = ON_ClassArray<ON_BrepLoop>::operator[]
                                                  ((ON_ClassArray<ON_BrepLoop> *)&this->m_L,
                                                   pOVar16->m_li);
                              if (-1 < pOVar17->m_fi) {
                                pOVar17 = ON_ClassArray<ON_BrepLoop>::operator[]
                                                    ((ON_ClassArray<ON_BrepLoop> *)&this->m_L,
                                                     pOVar16->m_li);
                                iVar1 = pOVar17->m_fi;
                                iVar10 = ON_ClassArray<ON_BrepFace>::Count
                                                   ((ON_ClassArray<ON_BrepFace> *)&this->m_F);
                                if (iVar1 < iVar10) {
                                  pOVar17 = ON_ClassArray<ON_BrepLoop>::operator[]
                                                      ((ON_ClassArray<ON_BrepLoop> *)&this->m_L,
                                                       pOVar16->m_li);
                                  pOVar18 = ON_ClassArray<ON_BrepFace>::operator[]
                                                      ((ON_ClassArray<ON_BrepFace> *)&this->m_F,
                                                       pOVar17->m_fi);
                                  if ((pOVar18->m_bRev & 1U) != 0) {
                                    local_8a = (local_8a ^ 0xff) & 1;
                                  }
                                  if ((local_89 == 0) || (local_8a == 0)) {
                                    if ((local_89 == 0) && (local_8a == 0)) {
                                      other_ti._2_1_ = false;
                                    }
                                  }
                                  else {
                                    other_ti._2_1_ = false;
                                  }
                                  goto LAB_00537591;
                                }
                              }
                              ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_brep.cpp"
                                         ,0x1bdf,"","Bogus face index in m_L[other_trim.m_li]");
                            }
                            goto LAB_00537591;
                          }
                        }
                        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_brep.cpp"
                                   ,0x1bcc,"","Bogus face index in m_L[trim.m_li]");
                      }
                    }
                  }
                  else {
                    other_ti._3_1_ = false;
                    if (pbHasBoundary == (bool *)0x0) {
                      face._3_1_ = false;
                    }
                  }
                }
              }
              else if ((TVar2 != singular) && (other_ti._3_1_ = false, pbHasBoundary == (bool *)0x0)
                      ) {
                face._3_1_ = false;
              }
            }
LAB_00537591:
            brep_trim_count = brep_trim_count + 1;
          }
        }
        brep_loop_count = brep_loop_count + 1;
      }
    }
    lcnt = lcnt + 1;
  } while( true );
}

Assistant:

bool
ON_Brep::IsManifold( bool* pbIsOriented, bool* pbHasBoundary ) const
{
  const int fcnt = m_F.Count();
  bool bIsManifold = (fcnt > 0) ? true : false;
  bool bIsOriented = bIsManifold;
  bool bHasBoundary = false;
  int fi, other_ti, lcnt, tcnt, fli, lti;
  if ( pbIsOriented )
    *pbIsOriented = bIsOriented;
  if ( pbHasBoundary )
    *pbHasBoundary = bHasBoundary;
  const int brep_loop_count = m_L.Count();
  const int brep_trim_count = m_T.Count();
  const int brep_edge_count = m_E.Count();

  bool bKeepGoing = bIsManifold;

  for ( fi = 0; fi < fcnt && bKeepGoing; fi++ ) 
  {
    const ON_BrepFace& face = m_F[fi];
    if ( -1 == face.m_face_index )
    {
      // 28 October 2010 - Dale Lear and Chuck
      //    Do not test deleted faces. The join
      //    command calls is manifold with some
      //    deleted faces to avoid calling Compact
      //    lots of times during a join.
      continue;
    }

    lcnt = face.m_li.Count();
    if ( lcnt < 1 ) {
      bIsManifold = false;
      if (!pbHasBoundary)
        bKeepGoing = false;
    }

    for ( fli = 0; fli < lcnt && bKeepGoing; fli++ ) 
    {
      const int li = face.m_li[fli];
      if ( li < 0 || li >= brep_loop_count )
      {
        ON_ERROR("Bogus loop index in face.m_li[]");
        continue;
      }
      const ON_BrepLoop& loop = m_L[li];
      tcnt = loop.m_ti.Count();
      if (tcnt < 1 ) {
        bIsManifold = false;
        if (!pbHasBoundary)
          bKeepGoing = false;
      }
      for ( lti = 0; lti < tcnt && bKeepGoing; lti++ ) 
      {
        const int ti = loop.m_ti[lti];
        if ( ti < 0 || ti >= brep_trim_count )
        {
          ON_ERROR("Bogus loop index in loop.m_ti[]");
          continue;
        }
        const ON_BrepTrim& trim = m_T[ti];
        switch ( trim.m_type ) 
        {
        case ON_BrepTrim::boundary:
          bHasBoundary = true;
          break;
        case ON_BrepTrim::mated:
        case ON_BrepTrim::seam:
          // make sure we have a manifold join
          if ( trim.m_ei >= 0 && trim.m_ei < brep_edge_count )
          {
            const ON_BrepEdge& edge = m_E[trim.m_ei];
            if ( edge.m_ti.Count() != 2 ) {
              bIsManifold = false;
              if (!pbHasBoundary)
                bKeepGoing = false;
            }
            else 
            {
              other_ti = edge.m_ti[0];
              if ( other_ti == ti )
                other_ti = edge.m_ti[1];
              if ( other_ti == ti )
              {
                bIsManifold = false;
                if (!pbHasBoundary)
                  bKeepGoing = false;
              }
              else 
              {
                const ON_BrepTrim& other_trim = m_T[other_ti];

                // Nov 9, 2011 Tim - Fix for crash bug RR 93743
                // Better index checking.

                bool bFlipTrim = trim.m_bRev3d;
                if (0 <= trim.m_li && brep_loop_count > trim.m_li)
                {
                  if (m_L[trim.m_li].m_fi >= 0 && m_L[trim.m_li].m_fi < m_F.Count()){
                    if ( m_F[m_L[trim.m_li].m_fi].m_bRev )
                      bFlipTrim = !bFlipTrim;
                  }
                  else
                  {
                    ON_ERROR("Bogus face index in m_L[trim.m_li]");
                    continue;
                  }
                }
                else
                {
                  ON_ERROR("Bogus loop index in trim.m_li");
                  continue;
                }

                bool bFlipOther = other_trim.m_bRev3d;
                if (0 <= other_trim.m_li && brep_loop_count > other_trim.m_li)
                {
                  if (m_L[other_trim.m_li].m_fi >= 0 && m_L[other_trim.m_li].m_fi < m_F.Count()){
                    if ( m_F[m_L[other_trim.m_li].m_fi].m_bRev )
                      bFlipOther = !bFlipOther;
                  }
                  else
                  {
                    ON_ERROR("Bogus face index in m_L[other_trim.m_li]");
                    continue;
                  }
                }
                else
                {
                  ON_ERROR("Bogus loop index in other_trim.m_li");
                  continue;
                }

                if ( bFlipTrim && bFlipOther )
                {
                  bIsOriented = false;
                }
                else if ( !bFlipTrim && !bFlipOther )
                {
                  bIsOriented = false;
                }
              }
            }
          }
          else
          {
            ON_ERROR("Bogus trim.m_ei or trim.m_type value");
          }
          break;
        case ON_BrepTrim::singular:
          // nothing to check here
          break;
        default:
          bIsManifold = false;
          if (!pbHasBoundary)
            bKeepGoing = false;

          break;
        }
      }
    }
  }
  if ( !bIsManifold ) {
    bIsOriented = false;
    //21 June 2017 - Chuck - bHasBoundary just says if there are any naked edges.
    //Even if the brep is non-manifold, this should still be the case.
    //bHasBoundary = false;
  }
  if ( pbIsOriented )
    *pbIsOriented = bIsOriented;
  if ( pbHasBoundary )
    *pbHasBoundary = bHasBoundary;
  if ( !bIsManifold || bHasBoundary )
  {
    if ( m_is_solid != 3 )
    {
      // lazy evaluation used on m_is_solid
      const_cast<ON_Brep*>(this)->m_is_solid = 3;
    }
  }

  return bIsManifold;
}